

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress.c
# Opt level: O2

void Abc_NtkDress(Abc_Ntk_t *pNtkLogic,char *pFileName,int fVerbose)

{
  long *plVar1;
  Io_FileType_t FileType;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  stmm_table *table;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  uint uVar7;
  Abc_Obj_t *pNodeMap;
  ulong local_50;
  uint local_44;
  Abc_Ntk_t *local_40;
  char *local_38;
  
  if (pNtkLogic->ntkType != ABC_NTK_LOGIC) {
    pcVar6 = "Abc_NtkIsLogic(pNtkLogic)";
    uVar7 = 0x39;
LAB_00235640:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                  ,uVar7,"void Abc_NtkDress(Abc_Ntk_t *, char *, int)");
  }
  FileType = Io_ReadFileType(pFileName);
  pNtk = Io_ReadNetlist(pFileName,FileType,1);
  if (pNtk != (Abc_Ntk_t *)0x0) {
    if (pNtk->ntkType != ABC_NTK_NETLIST) {
      pcVar6 = "Abc_NtkIsNetlist(pNtkOrig)";
      uVar7 = 0x3f;
      goto LAB_00235640;
    }
    Abc_NtkCleanCopy(pNtkLogic);
    Abc_NtkCleanCopy(pNtk);
    pNtk2 = Abc_NtkToLogic(pNtk);
    iVar2 = Abc_NtkCompareSignals(pNtkLogic,pNtk2,1,1);
    if (iVar2 == 0) {
      Abc_NtkDelete(pNtk);
      Abc_NtkDelete(pNtk2);
      return;
    }
    pNtk1 = Abc_NtkStrash(pNtkLogic,1,0,0);
    Abc_NtkAppend(pNtk1,pNtk2,1);
    Abc_NtkTransferCopy(pNtk);
    Abc_NtkDelete(pNtk2);
    if (fVerbose != 0) {
      puts("After mitering:");
      uVar7 = pNtkLogic->nObjCounts[7];
      uVar3 = Abc_NtkCountCopy(pNtkLogic);
      printf("Logic:  Nodes = %5d. Copy = %5d. \n",(ulong)uVar7,(ulong)uVar3);
      uVar7 = pNtk->nObjCounts[7];
      uVar3 = Abc_NtkCountCopy(pNtk);
      printf("Orig:   Nodes = %5d. Copy = %5d. \n",(ulong)uVar7,(ulong)uVar3);
    }
    local_40 = Abc_NtkIvyFraig(pNtk1,100,1,0,1,0);
    Abc_NtkTransferCopy(pNtkLogic);
    Abc_NtkTransferCopy(pNtk);
    Abc_NtkDelete(pNtk1);
    if (fVerbose != 0) {
      puts("After fraiging:");
      uVar7 = pNtkLogic->nObjCounts[7];
      uVar3 = Abc_NtkCountCopy(pNtkLogic);
      printf("Logic:  Nodes = %5d. Copy = %5d. \n",(ulong)uVar7,(ulong)uVar3);
      uVar7 = pNtk->nObjCounts[7];
      uVar3 = Abc_NtkCountCopy(pNtk);
      printf("Orig:   Nodes = %5d. Copy = %5d. \n",(ulong)uVar7,(ulong)uVar3);
    }
    if (pNtk->ntkType != ABC_NTK_NETLIST) {
      __assert_fail("Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                    ,0x87,"stmm_table *Abc_NtkDressDeriveMapping(Abc_Ntk_t *)");
    }
    table = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
    for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,iVar2);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
        pcVar6 = (char *)((ulong)(pAVar5->field_6).pTemp & 0xfffffffffffffffe);
        iVar4 = stmm_lookup(table,pcVar6,(char **)0x0);
        if (iVar4 == 0) {
          stmm_insert(table,pcVar6,(char *)((ulong)((pAVar5->field_6).iTemp & 1) ^ (ulong)pAVar5));
        }
      }
    }
    if (pNtkLogic->ntkType != ABC_NTK_LOGIC) {
      __assert_fail("Abc_NtkIsLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                    ,0xa8,"void Abc_NtkDressTransferNames(Abc_Ntk_t *, stmm_table *, int)");
    }
    local_44 = table->num_entries;
    uVar7 = 0;
    local_50 = 0;
    for (iVar2 = 0; iVar2 < pNtkLogic->vObjs->nSize; iVar2 = iVar2 + 1) {
      pAVar5 = Abc_NtkObj(pNtkLogic,iVar2);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
        pcVar6 = Nm_ManFindNameById(pNtkLogic->pManName,pAVar5->Id);
        if (pcVar6 == (char *)0x0) {
          local_38 = (char *)((ulong)(pAVar5->field_6).pTemp & 0xfffffffffffffffe);
          iVar4 = stmm_lookup(table,local_38,(char **)&pNodeMap);
          if (iVar4 != 0) {
            plVar1 = *(long **)(*(long *)(*(long *)(*(long *)((ulong)pNodeMap & 0xfffffffffffffffe)
                                                   + 0x20) + 8) +
                               (long)*(int *)((long *)((ulong)pNodeMap & 0xfffffffffffffffe))[6] * 8
                               );
            pNodeMap = (Abc_Obj_t *)((ulong)((pAVar5->field_6).iTemp & 1) ^ (ulong)pNodeMap);
            pcVar6 = Nm_ManFindNameById(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
            if (pcVar6 == (char *)0x0) {
              __assert_fail("pName != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                            ,0xb9,"void Abc_NtkDressTransferNames(Abc_Ntk_t *, stmm_table *, int)");
            }
            if (((ulong)pNodeMap & 1) == 0) {
              Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
              uVar7 = uVar7 + 1;
            }
            else {
              Abc_ObjAssignName(pAVar5,pcVar6,"_inv");
              local_50 = (ulong)((int)local_50 + 1);
            }
            stmm_delete(table,&local_38,(char **)&pNodeMap);
          }
        }
      }
    }
    if (fVerbose != 0) {
      printf("Total number of names collected = %5d.\n",(ulong)local_44);
      printf("Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n",
             (ulong)((int)local_50 + uVar7),(ulong)uVar7);
    }
    stmm_free_table(table);
    Abc_NtkDelete(local_40);
    Abc_NtkDelete(pNtk);
  }
  return;
}

Assistant:

void Abc_NtkDress( Abc_Ntk_t * pNtkLogic, char * pFileName, int fVerbose )
{
    Abc_Ntk_t * pNtkOrig, * pNtkLogicOrig;
    Abc_Ntk_t * pMiter, * pMiterFraig;
    stmm_table * tMapping;

    assert( Abc_NtkIsLogic(pNtkLogic) );

    // get the original netlist
    pNtkOrig = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), 1 );
    if ( pNtkOrig == NULL )
        return;
    assert( Abc_NtkIsNetlist(pNtkOrig) );

    Abc_NtkCleanCopy(pNtkLogic);
    Abc_NtkCleanCopy(pNtkOrig);

    // convert it into the logic network
    pNtkLogicOrig = Abc_NtkToLogic( pNtkOrig );
    // check that the networks have the same PIs/POs/latches
    if ( !Abc_NtkCompareSignals( pNtkLogic, pNtkLogicOrig, 1, 1 ) )
    {
        Abc_NtkDelete( pNtkOrig );
        Abc_NtkDelete( pNtkLogicOrig );
        return;
    }

    // convert the current logic network into an AIG
    pMiter = Abc_NtkStrash( pNtkLogic, 1, 0, 0 );

    // convert it into the AIG and make the netlist point to the AIG
    Abc_NtkAppend( pMiter, pNtkLogicOrig, 1 );
    Abc_NtkTransferCopy( pNtkOrig );
    Abc_NtkDelete( pNtkLogicOrig );

if ( fVerbose ) 
{
printf( "After mitering:\n" );
printf( "Logic:  Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkLogic), Abc_NtkCountCopy(pNtkLogic) );
printf( "Orig:   Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkOrig),  Abc_NtkCountCopy(pNtkOrig) );
}

    // fraig the miter (miter nodes point to the fraiged miter)
    pMiterFraig = Abc_NtkIvyFraig( pMiter, 100, 1, 0, 1, 0 );
    // make netlists point to the fraiged miter
    Abc_NtkTransferCopy( pNtkLogic );
    Abc_NtkTransferCopy( pNtkOrig );
    Abc_NtkDelete( pMiter );

if ( fVerbose ) 
{
printf( "After fraiging:\n" );
printf( "Logic:  Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkLogic), Abc_NtkCountCopy(pNtkLogic) );
printf( "Orig:   Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkOrig),  Abc_NtkCountCopy(pNtkOrig) );
}

    // derive mapping from the fraiged nodes into their prototype nodes in the original netlist
    tMapping = Abc_NtkDressDeriveMapping( pNtkOrig );

    // transfer the names to the new netlist
    Abc_NtkDressTransferNames( pNtkLogic, tMapping, fVerbose );

    // clean up
    stmm_free_table( tMapping );
    Abc_NtkDelete( pMiterFraig );
    Abc_NtkDelete( pNtkOrig );
}